

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# childgenerator.cpp
# Opt level: O3

string * __thiscall
ChildGenerator::handleFieldGeneration_abi_cxx11_
          (string *__return_storage_ptr__,ChildGenerator *this,int fieldIndex)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  pointer pCVar7;
  int iVar8;
  undefined1 *puVar9;
  int iVar10;
  long *plVar11;
  char *pcVar12;
  size_type sVar13;
  undefined8 *puVar14;
  ulong *puVar15;
  size_type *psVar16;
  int *arg;
  char *tmp_finish;
  ulong uVar17;
  _Alloc_hider _Var18;
  undefined8 uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> result;
  string msgString;
  string listIndexString;
  string type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 *local_168;
  string local_160;
  string *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_140 = __return_storage_ptr__;
  getFieldType_abi_cxx11_(&local_90,this,fieldIndex);
  iVar10 = std::__cxx11::string::compare((char *)&local_90);
  if (iVar10 == 0) {
    std::operator+(&local_138,"    ",&this->parentName_);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
    paVar1 = &local_160.field_2;
    puVar15 = (ulong *)(plVar11 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar11 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_160.field_2._M_allocated_capacity = *puVar15;
      local_160.field_2._8_8_ = plVar11[3];
      local_160._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_160.field_2._M_allocated_capacity = *puVar15;
      local_160._M_dataplus._M_p = (pointer)*plVar11;
    }
    local_160._M_string_length = plVar11[1];
    *plVar11 = (long)puVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    getFieldMsg_abi_cxx11_(&local_118,this,fieldIndex);
    uVar19 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      uVar19 = local_160.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar19 < local_160._M_string_length + local_118._M_string_length) {
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        uVar19 = local_118.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar19 < local_160._M_string_length + local_118._M_string_length)
      goto LAB_00117026;
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_118,0,(char *)0x0,(ulong)local_160._M_dataplus._M_p);
    }
    else {
LAB_00117026:
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_160,(ulong)local_118._M_dataplus._M_p);
    }
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    puVar15 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_1a8.field_2._M_allocated_capacity = *puVar15;
      local_1a8.field_2._8_8_ = puVar14[3];
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar15;
      local_1a8._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_1a8._M_string_length = puVar14[1];
    *puVar14 = puVar15;
    puVar14[1] = 0;
    *(char *)puVar15 = '\0';
    puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    puVar15 = puVar14 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar15) {
      local_188.field_2._M_allocated_capacity = *puVar15;
      local_188.field_2._8_8_ = puVar14[3];
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    }
    else {
      local_188.field_2._M_allocated_capacity = *puVar15;
      local_188._M_dataplus._M_p = (pointer)*puVar14;
    }
    local_188._M_string_length = puVar14[1];
    *puVar14 = puVar15;
    puVar14[1] = 0;
    *(undefined1 *)(puVar14 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar1) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    uVar19 = local_138.field_2._M_allocated_capacity;
    _Var18._M_p = local_138._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001185aa;
  }
  else {
    iVar10 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar10 == 0) {
      iVar6 = this->listIndex_;
      iVar10 = iVar6 + 1;
      this->listIndex_ = iVar10;
      paVar3 = &local_1a8.field_2;
      local_1a8._M_string_length = 0;
      local_1a8.field_2._M_allocated_capacity =
           local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_188.field_2._8_8_ = (long)&local_188._M_dataplus._M_p + 2;
      puVar9 = (undefined1 *)((long)&local_188.field_2 + 7);
      iVar8 = -iVar10;
      if (0 < iVar10) {
        iVar8 = iVar10;
      }
      local_160._M_dataplus._M_p._0_4_ = iVar8;
      local_160.field_2._M_local_buf[0] = 0x30;
      local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
      local_1a8._M_dataplus._M_p = (pointer)paVar3;
      local_168 = puVar9;
      local_160._M_string_length = (size_type)puVar9;
      local_f8 = paVar1;
      local_188.field_2._8_8_ =
           boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                     ((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)&local_160);
      if (iVar6 < -1) {
        *(char *)(local_188.field_2._8_8_ + -1) = '-';
        local_188.field_2._8_8_ = local_188.field_2._8_8_ + -1;
      }
      local_168 = puVar9;
      std::__cxx11::string::replace
                ((ulong)&local_1a8,0,(char *)local_1a8._M_string_length,local_188.field_2._8_8_);
      std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_f0,"    Bottle& ",&this->parentName_);
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      puVar15 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_118.field_2._M_allocated_capacity = *puVar15;
        local_118.field_2._8_8_ = plVar11[3];
      }
      else {
        local_118.field_2._M_allocated_capacity = *puVar15;
        local_118._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_118._M_string_length = plVar11[1];
      *plVar11 = (long)puVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_d0._M_dataplus._M_p)
      ;
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      puVar15 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_138.field_2._M_allocated_capacity = *puVar15;
        local_138.field_2._8_8_ = puVar14[3];
      }
      else {
        local_138.field_2._M_allocated_capacity = *puVar15;
        local_138._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_138._M_string_length = puVar14[1];
      *puVar14 = puVar15;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
      paVar1 = &local_160.field_2;
      puVar15 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_160.field_2._M_allocated_capacity = *puVar15;
        local_160.field_2._8_8_ = plVar11[3];
        local_160._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_160.field_2._M_allocated_capacity = *puVar15;
        local_160._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_160._M_string_length = plVar11[1];
      *plVar11 = (long)puVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar14 = (undefined8 *)
                std::__cxx11::string::_M_append
                          ((char *)&local_160,(ulong)(this->parentName_)._M_dataplus._M_p);
      puVar15 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_1a8.field_2._M_allocated_capacity = *puVar15;
        local_1a8.field_2._8_8_ = puVar14[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar15;
        local_1a8._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_1a8._M_string_length = puVar14[1];
      *puVar14 = puVar15;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      puVar15 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar15) {
        local_188.field_2._M_allocated_capacity = *puVar15;
        local_188.field_2._8_8_ = puVar14[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar15;
        local_188._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_188._M_string_length = puVar14[1];
      *puVar14 = puVar15;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar3) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != paVar1) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
      }
      paVar3 = &local_f0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar3) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      getFieldMsg_abi_cxx11_(&local_188,this,fieldIndex);
      if (local_188._M_string_length != 0) {
        uVar17 = 0;
        sVar13 = local_188._M_string_length;
        do {
          if ((sVar13 - 1 == uVar17) || (local_188._M_dataplus._M_p[uVar17] == ',')) {
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            local_1a8._M_string_length = 0;
            local_1a8.field_2._M_allocated_capacity =
                 local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (sVar13 - 1 == uVar17) {
              std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_188);
            }
            else {
              std::__cxx11::string::substr((ulong)&local_160,(ulong)&local_188);
            }
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_160);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            local_160._M_dataplus._M_p = " ";
            local_160._M_string_length = 0x11bed4;
            _Var18._M_p = local_1a8._M_dataplus._M_p;
            for (pcVar12 = (char *)local_1a8._M_string_length; pcVar12 != (char *)0x0;
                pcVar12 = pcVar12 + -1) {
              if (*_Var18._M_p == ' ') {
                boost::algorithm::detail::
                find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::empty_formatF<char>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::algorithm::detail::empty_container<char>>
                          (&local_1a8,_Var18._M_p,(char *)((long)_Var18._M_p + 1));
                break;
              }
              _Var18._M_p = _Var18._M_p + 1;
            }
            std::operator+(&local_70,"    ",&this->parentName_);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_70);
            psVar16 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_b0.field_2._M_allocated_capacity = *psVar16;
              local_b0.field_2._8_8_ = plVar11[3];
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
            }
            else {
              local_b0.field_2._M_allocated_capacity = *psVar16;
              local_b0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_b0._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)&local_b0,(ulong)local_d0._M_dataplus._M_p);
            psVar16 = (size_type *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_f0.field_2._M_allocated_capacity = *psVar16;
              local_f0.field_2._8_8_ = plVar11[3];
              local_f0._M_dataplus._M_p = (pointer)paVar3;
            }
            else {
              local_f0.field_2._M_allocated_capacity = *psVar16;
              local_f0._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_f0._M_string_length = plVar11[1];
            *plVar11 = (long)psVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
            puVar15 = (ulong *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_118.field_2._M_allocated_capacity = *puVar15;
              local_118.field_2._8_8_ = plVar11[3];
            }
            else {
              local_118.field_2._M_allocated_capacity = *puVar15;
              local_118._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_118._M_string_length = plVar11[1];
            *plVar11 = (long)puVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            puVar14 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_118,(ulong)local_1a8._M_dataplus._M_p);
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            puVar15 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_138.field_2._M_allocated_capacity = *puVar15;
              local_138.field_2._8_8_ = puVar14[3];
            }
            else {
              local_138.field_2._M_allocated_capacity = *puVar15;
              local_138._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_138._M_string_length = puVar14[1];
            *puVar14 = puVar15;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
            puVar15 = (ulong *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar15) {
              local_160.field_2._M_allocated_capacity = *puVar15;
              local_160.field_2._8_8_ = plVar11[3];
              local_160._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_160.field_2._M_allocated_capacity = *puVar15;
              local_160._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_160._M_string_length = plVar11[1];
            *plVar11 = (long)puVar15;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)local_140,(ulong)local_160._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_160._M_dataplus._M_p != paVar1) {
              operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_118._M_dataplus._M_p != &local_118.field_2) {
              operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != paVar3) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
            sVar13 = local_188._M_string_length;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
              sVar13 = local_188._M_string_length;
            }
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < sVar13);
      }
      std::__cxx11::string::append((char *)local_140);
      uVar19 = local_188.field_2._M_allocated_capacity;
      _Var18._M_p = local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_001185aa;
    }
    else {
      iVar10 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar10 == 0) {
        iVar6 = this->listIndex_;
        iVar10 = iVar6 + 1;
        this->listIndex_ = iVar10;
        paVar3 = &local_1a8.field_2;
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_allocated_capacity =
             local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_188.field_2._8_8_ = (long)&local_188._M_dataplus._M_p + 2;
        puVar9 = (undefined1 *)((long)&local_188.field_2 + 7);
        iVar8 = -iVar10;
        if (0 < iVar10) {
          iVar8 = iVar10;
        }
        local_160._M_dataplus._M_p._0_4_ = iVar8;
        local_160.field_2._M_local_buf[0] = 0x30;
        local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
        local_1a8._M_dataplus._M_p = (pointer)paVar3;
        local_168 = puVar9;
        local_160._M_string_length = (size_type)puVar9;
        local_f8 = paVar1;
        local_188.field_2._8_8_ =
             boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
                       ((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)&local_160
                       );
        if (iVar6 < -1) {
          *(char *)(local_188.field_2._8_8_ + -1) = '-';
          local_188.field_2._8_8_ = local_188.field_2._8_8_ + -1;
        }
        local_168 = puVar9;
        std::__cxx11::string::replace
                  ((ulong)&local_1a8,0,(char *)local_1a8._M_string_length,local_188.field_2._8_8_);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if (this->toRos_ == true) {
          std::__cxx11::string::append((char *)local_140);
          std::__cxx11::string::append((char *)local_140);
          psVar2 = &this->parentName_;
          std::operator+(&local_f0,"    Bottle& ",psVar2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          puVar15 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_118.field_2._M_allocated_capacity = *puVar15;
            local_118.field_2._8_8_ = plVar11[3];
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar15;
            local_118._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_118._M_string_length = plVar11[1];
          *plVar11 = (long)puVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
          paVar1 = &local_138.field_2;
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_138.field_2._M_allocated_capacity = *puVar15;
            local_138.field_2._8_8_ = puVar14[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar15;
            local_138._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_138._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar4 = &local_160.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160.field_2._8_8_ = plVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_160,
                                       (ulong)(this->parentName_)._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          paVar5 = &local_188.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188.field_2._8_8_ = plVar11[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_188._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar5) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar4) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160.field_2._8_8_ = plVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_160,(ulong)local_d0._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188.field_2._8_8_ = plVar11[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_188._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar5) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar4) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar2);
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_160.field_2._M_allocated_capacity = *puVar15;
            local_160.field_2._8_8_ = puVar14[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *puVar15;
            local_160._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_160._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)local_d0._M_dataplus._M_p);
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_1a8.field_2._M_allocated_capacity = *puVar15;
            local_1a8.field_2._8_8_ = puVar14[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar15;
            local_1a8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1a8._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_188.field_2._M_allocated_capacity = *puVar15;
            local_188.field_2._8_8_ = puVar14[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar15;
            local_188._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_188._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
        }
        else {
          psVar2 = &this->parentName_;
          std::operator+(&local_f0,"    Bottle& ",psVar2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
          puVar15 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_118.field_2._M_allocated_capacity = *puVar15;
            local_118.field_2._8_8_ = plVar11[3];
            local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          }
          else {
            local_118.field_2._M_allocated_capacity = *puVar15;
            local_118._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_118._M_string_length = plVar11[1];
          *plVar11 = (long)puVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_118,(ulong)local_d0._M_dataplus._M_p);
          paVar1 = &local_138.field_2;
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_138.field_2._M_allocated_capacity = *puVar15;
            local_138.field_2._8_8_ = puVar14[3];
            local_138._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_138.field_2._M_allocated_capacity = *puVar15;
            local_138._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_138._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
          paVar4 = &local_160.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160.field_2._8_8_ = plVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_160,
                                       (ulong)(this->parentName_)._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          paVar5 = &local_188.field_2;
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188.field_2._8_8_ = plVar11[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_188._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar5) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar4) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160.field_2._8_8_ = plVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *psVar16;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_160,(ulong)local_d0._M_dataplus._M_p);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8.field_2._8_8_ = plVar11[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *psVar16;
            local_1a8._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_1a8._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
          psVar16 = (size_type *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188.field_2._8_8_ = plVar11[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar16;
            local_188._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_188._M_string_length = plVar11[1];
          *plVar11 = (long)psVar16;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar5) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar3) {
            operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != paVar4) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != paVar1) {
            operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          }
          std::operator+(&local_138,"    ",psVar2);
          plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
          puVar15 = (ulong *)(plVar11 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar11 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_160.field_2._M_allocated_capacity = *puVar15;
            local_160.field_2._8_8_ = plVar11[3];
            local_160._M_dataplus._M_p = (pointer)paVar4;
          }
          else {
            local_160.field_2._M_allocated_capacity = *puVar15;
            local_160._M_dataplus._M_p = (pointer)*plVar11;
          }
          local_160._M_string_length = plVar11[1];
          *plVar11 = (long)puVar15;
          plVar11[1] = 0;
          *(undefined1 *)(plVar11 + 2) = 0;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_160,(ulong)local_d0._M_dataplus._M_p);
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_1a8.field_2._M_allocated_capacity = *puVar15;
            local_1a8.field_2._8_8_ = puVar14[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar15;
            local_1a8._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_1a8._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
          puVar15 = puVar14 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar14 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar15) {
            local_188.field_2._M_allocated_capacity = *puVar15;
            local_188.field_2._8_8_ = puVar14[3];
            local_188._M_dataplus._M_p = (pointer)paVar5;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar15;
            local_188._M_dataplus._M_p = (pointer)*puVar14;
          }
          local_188._M_string_length = puVar14[1];
          *puVar14 = puVar15;
          puVar14[1] = 0;
          *(undefined1 *)(puVar14 + 2) = 0;
          std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._M_dataplus._M_p != &local_160.field_2) {
          operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_138.field_2._M_allocated_capacity;
        _Var18._M_p = local_138._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p == &local_138.field_2) goto LAB_001185aa;
      }
      else {
        iVar10 = std::__cxx11::string::compare((char *)&local_90);
        if (iVar10 != 0) {
          iVar10 = std::__cxx11::string::compare((char *)&local_90);
          if (iVar10 == 0) {
            iVar6 = this->listIndex_;
            iVar10 = iVar6 + 1;
            this->listIndex_ = iVar10;
            local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            local_1a8._M_string_length = 0;
            local_1a8.field_2._M_allocated_capacity =
                 local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
            local_188.field_2._8_8_ = (long)&local_188._M_dataplus._M_p + 2;
            puVar9 = (undefined1 *)((long)&local_188.field_2 + 7);
            iVar8 = -iVar10;
            if (0 < iVar10) {
              iVar8 = iVar10;
            }
            local_160._M_dataplus._M_p._0_4_ = iVar8;
            local_160.field_2._M_local_buf[0] = 0x30;
            local_160.field_2._M_allocated_capacity._4_4_ = 0x30;
            local_168 = puVar9;
            local_160._M_string_length = (size_type)puVar9;
            local_f8 = paVar1;
            local_188.field_2._8_8_ =
                 boost::detail::lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char>::
                 convert((lcast_put_unsigned<std::char_traits<char>,_unsigned_int,_char> *)
                         &local_160);
            if (iVar6 < -1) {
              *(char *)(local_188.field_2._8_8_ + -1) = '-';
              local_188.field_2._8_8_ = local_188.field_2._8_8_ + -1;
            }
            local_168 = puVar9;
            std::__cxx11::string::replace
                      ((ulong)&local_1a8,0,(char *)local_1a8._M_string_length,
                       local_188.field_2._8_8_);
            std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_1a8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if (this->toRos_ == true) {
              psVar2 = &this->parentName_;
              std::operator+(&local_f0,"    Bottle& ",psVar2);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_118.field_2._M_allocated_capacity = *psVar16;
                local_118.field_2._8_8_ = plVar11[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *psVar16;
                local_118._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_118._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d0);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_138);
              paVar1 = &local_160.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_160.field_2._M_allocated_capacity = *psVar16;
                local_160.field_2._8_8_ = plVar11[3];
                local_160._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_160.field_2._M_allocated_capacity = *psVar16;
                local_160._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_160._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_1a8,&local_160,psVar2);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
              paVar3 = &local_188.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188.field_2._8_8_ = plVar11[3];
                local_188._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_188._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar3) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              getFieldMux_abi_cxx11_(&local_160,this,fieldIndex);
              std::operator+(&local_1a8,"    for(int i = 0; i < ",&local_160);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188.field_2._8_8_ = plVar11[3];
                local_188._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_188._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar3) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_f0,"      ",psVar2);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
              local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              puVar15 = (ulong *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118.field_2._8_8_ = plVar11[3];
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_118._M_string_length = plVar11[1];
              *plVar11 = (long)puVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d0);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160.field_2._8_8_ = puVar14[3];
                local_160._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_160._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              getFieldMux_abi_cxx11_(&local_b0,this,fieldIndex);
              std::operator+(&local_1a8,&local_160,&local_b0);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188.field_2._8_8_ = puVar14[3];
                local_188._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_188._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar3) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar1) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            else {
              getFieldMux_abi_cxx11_(&local_160,this,fieldIndex);
              std::operator+(&local_1a8,"    for(int i = 0; i < ",&local_160);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_1a8);
              paVar1 = &local_188.field_2;
              psVar16 = (size_type *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188.field_2._8_8_ = plVar11[3];
                local_188._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_188.field_2._M_allocated_capacity = *psVar16;
                local_188._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_188._M_string_length = plVar11[1];
              *plVar11 = (long)psVar16;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              paVar3 = &local_160.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar3) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              std::operator+(&local_f0,"      ",&this->parentName_);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
              puVar15 = (ulong *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118.field_2._8_8_ = plVar11[3];
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_118._M_string_length = plVar11[1];
              *plVar11 = (long)puVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d0);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160.field_2._8_8_ = puVar14[3];
                local_160._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_160._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              getFieldMux_abi_cxx11_(&local_b0,this,fieldIndex);
              std::operator+(&local_1a8,&local_160,&local_b0);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188.field_2._8_8_ = puVar14[3];
                local_188._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_188._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != paVar3) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
            }
            std::__cxx11::string::append((char *)local_140);
          }
          else {
            iVar10 = std::__cxx11::string::compare((char *)&local_90);
            if (iVar10 == 0) {
              this->listIndex_ = this->listIndex_ + 1;
              local_f8 = paVar1;
              boost::lexical_cast<std::__cxx11::string,int>
                        (&local_188,(boost *)&this->listIndex_,arg);
              std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_188);
              paVar1 = &local_188.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              psVar2 = &this->parentName_;
              std::operator+(&local_f0,"    Bottle& ",psVar2);
              plVar11 = (long *)std::__cxx11::string::append((char *)&local_f0);
              puVar15 = (ulong *)(plVar11 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118.field_2._8_8_ = plVar11[3];
                local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
              }
              else {
                local_118.field_2._M_allocated_capacity = *puVar15;
                local_118._M_dataplus._M_p = (pointer)*plVar11;
              }
              local_118._M_string_length = plVar11[1];
              *plVar11 = (long)puVar15;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::operator+(&local_138,&local_118,&local_d0);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160.field_2._8_8_ = puVar14[3];
                local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
              }
              else {
                local_160.field_2._M_allocated_capacity = *puVar15;
                local_160._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_160._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::operator+(&local_1a8,&local_160,psVar2);
              puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
              puVar15 = puVar14 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar14 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)puVar15) {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188.field_2._8_8_ = puVar14[3];
                local_188._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_188.field_2._M_allocated_capacity = *puVar15;
                local_188._M_dataplus._M_p = (pointer)*puVar14;
              }
              local_188._M_string_length = puVar14[1];
              *puVar14 = puVar15;
              puVar14[1] = 0;
              *(undefined1 *)(puVar14 + 2) = 0;
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
                operator_delete(local_1a8._M_dataplus._M_p,
                                local_1a8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_160._M_dataplus._M_p != &local_160.field_2) {
                operator_delete(local_160._M_dataplus._M_p,
                                local_160.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_138._M_dataplus._M_p != &local_138.field_2) {
                operator_delete(local_138._M_dataplus._M_p,
                                local_138.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1
                               );
              }
              pCVar7 = (this->children_).
                       super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->children_).
                  super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                  super__Vector_impl_data._M_finish == pCVar7) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              std::operator+(&local_188,psVar2,"_");
              std::operator+(&local_50,&local_188,&local_d0);
              std::__cxx11::string::_M_assign((string *)&pCVar7->parentName_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              pCVar7 = (this->children_).
                       super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if ((this->children_).
                  super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl.
                  super__Vector_impl_data._M_finish == pCVar7) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,0,0);
              }
              (**(pCVar7->super_YarpCodeGenerator)._vptr_YarpCodeGenerator)(&local_188);
              std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_188._M_dataplus._M_p != paVar1) {
                operator_delete(local_188._M_dataplus._M_p,
                                local_188.field_2._M_allocated_capacity + 1);
              }
              std::vector<ChildGenerator,_std::allocator<ChildGenerator>_>::erase
                        (&this->children_,
                         (this->children_).
                         super__Vector_base<ChildGenerator,_std::allocator<ChildGenerator>_>._M_impl
                         .super__Vector_impl_data._M_start);
            }
          }
          goto LAB_001185aa;
        }
        std::operator+(&local_1a8,"    ",&this->parentName_);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
        puVar15 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar15) {
          local_188.field_2._M_allocated_capacity = *puVar15;
          local_188.field_2._8_8_ = puVar14[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar15;
          local_188._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_188._M_string_length = puVar14[1];
        *puVar14 = puVar15;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_140,(ulong)local_188._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        uVar19 = local_1a8.field_2._M_allocated_capacity;
        _Var18._M_p = local_1a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) goto LAB_001185aa;
      }
    }
  }
  operator_delete(_Var18._M_p,uVar19 + 1);
LAB_001185aa:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,
                    CONCAT71(local_d0.field_2._M_allocated_capacity._1_7_,
                             local_d0.field_2._M_local_buf[0]) + 1);
  }
  return local_140;
}

Assistant:

std::string ChildGenerator::handleFieldGeneration(int fieldIndex) {
  std::string code;

  std::string listIndexString;

  std::string type = getFieldType(fieldIndex);

  if(type == "single_value") {
    code += "    " + parentName_ + ".add(" + getFieldMsg(fieldIndex) + ");\n\n";
  } else if(type == "list") {
      listIndex_++;
      listIndexString = boost::lexical_cast<std::string>(listIndex_);
      code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
      int elementIndex = 0;
      std::string msgString = getFieldMsg(fieldIndex);
      for(int i = 0; i < msgString.size(); i++) {
        if(msgString.at(i) == ',' || i == (msgString.size() - 1)) {
          std::string elementString;
          if(i == (msgString.size() - 1))
            elementString = msgString.substr(elementIndex, ((i - elementIndex) + 1));
          else
            elementString = msgString.substr(elementIndex, (i - elementIndex));
          boost::erase_all(elementString, " ");
          code += "    " + parentName_ + "_" + listIndexString + ".add(" + elementString + ");\n";
          elementIndex = i + 1;
        }
      }
      code += "\n";
    } else if(type == "timestamp") {
        listIndex_++;
        listIndexString = boost::lexical_cast<std::string>(listIndex_);
        if (toRos_){
            code += "    double dummy;\n";
            code += "    double frac=modf(timestamp,&dummy);\n";
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)timestamp);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add((int)round(frac*pow(10,9)));\n\n";
        }
        else {
            code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(counter);\n";
            code += "    " + parentName_ + "_" + listIndexString + ".add(timestamp);\n";
        }
      } else if(type == "counter") {
          code += "    " + parentName_ + ".add(counter);\n\n";
        } else if(type == "mux") {
            listIndex_++;
            listIndexString = boost::lexical_cast<std::string>(listIndex_);
            if (toRos_)
            {
                code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }
            else {
                code += "    for(int i = 0; i < " + getFieldMux(fieldIndex) + ".size(); i++) {\n";
                code += "      " + parentName_ + "_" + listIndexString + ".add(" + getFieldMux(fieldIndex) + ".get(i));\n";
                code += "    }\n\n";
            }

          } else if(type == "msg") {
              listIndex_++;
              listIndexString = boost::lexical_cast<std::string>(listIndex_);
              code += "    Bottle& " + parentName_ + "_" + listIndexString + " = " + parentName_ + ".addList();\n\n";
              getFirstChild().setParentName(parentName_ + "_" + listIndexString);
              code += getFirstChild().generateCode();
              removeFirstChild();
            }

  return code;
}